

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpTestLog.c
# Opt level: O0

deBool qpTestLog_endCase(qpTestLog *log,qpTestResult result,char *resultDetails)

{
  deBool dVar1;
  undefined1 local_50 [8];
  qpXmlAttribute statusAttrib;
  char *statusStr;
  char *resultDetails_local;
  qpTestResult result_local;
  qpTestLog *log_local;
  
  statusAttrib._24_8_ = qpLookupString(s_qpTestResultMap,0xb,result);
  qpSetStringAttrib((qpXmlAttribute *)local_50,"StatusCode",(char *)statusAttrib._24_8_);
  deMutex_lock(log->lock);
  dVar1 = qpXmlWriter_startElement(log->writer,"Result",1,(qpXmlAttribute *)local_50);
  if (((dVar1 != 0) &&
      (((resultDetails == (char *)0x0 ||
        (dVar1 = qpXmlWriter_writeString(log->writer,resultDetails), dVar1 != 0)) &&
       (dVar1 = qpXmlWriter_endElement(log->writer,"Result"), dVar1 != 0)))) &&
     ((dVar1 = qpXmlWriter_endElement(log->writer,"TestCaseResult"), dVar1 != 0 &&
      (dVar1 = qpXmlWriter_endDocument(log->writer), dVar1 != 0)))) {
    qpXmlWriter_flush(log->writer);
    fprintf((FILE *)log->outputFile,"\n#endTestCaseResult\n");
    if ((log->flags & 4) == 0) {
      qpTestLog_flushFile(log);
    }
    log->isCaseOpen = 0;
    deMutex_unlock(log->lock);
    return 1;
  }
  qpPrintf("qpTestLog_endCase(): Writing XML failed\n");
  deMutex_unlock(log->lock);
  return 0;
}

Assistant:

deBool qpTestLog_endCase (qpTestLog* log, qpTestResult result, const char* resultDetails)
{
	const char*		statusStr		= QP_LOOKUP_STRING(s_qpTestResultMap, result);
	qpXmlAttribute	statusAttrib	= qpSetStringAttrib("StatusCode", statusStr);

	deMutex_lock(log->lock);

	DE_ASSERT(log->isCaseOpen);
	DE_ASSERT(ContainerStack_isEmpty(&log->containerStack));

	/* <Result StatusCode="Pass">Result details</Result>
	 * </TestCaseResult>
	 */
	if (!qpXmlWriter_startElement(log->writer, "Result", 1, &statusAttrib) ||
		(resultDetails && !qpXmlWriter_writeString(log->writer, resultDetails)) ||
		!qpXmlWriter_endElement(log->writer, "Result") ||
		!qpXmlWriter_endElement(log->writer, "TestCaseResult") ||
		!qpXmlWriter_endDocument(log->writer))		/* Close any XML elements still open */
	{
		qpPrintf("qpTestLog_endCase(): Writing XML failed\n");
		deMutex_unlock(log->lock);
		return DE_FALSE;
	}

	/* Flush XML and write #endTestCaseResult. */
	qpXmlWriter_flush(log->writer);
	fprintf(log->outputFile, "\n#endTestCaseResult\n");
	if (!(log->flags & QP_TEST_LOG_NO_FLUSH))
		qpTestLog_flushFile(log);

	log->isCaseOpen = DE_FALSE;

	deMutex_unlock(log->lock);
	return DE_TRUE;
}